

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O1

void __thiscall pbrt::TransformedSceneEntity::TransformedSceneEntity(TransformedSceneEntity *this)

{
  memory_resource *pmVar1;
  
  (this->super_SceneEntity).name._M_dataplus._M_p = (pointer)&(this->super_SceneEntity).name.field_2
  ;
  (this->super_SceneEntity).name._M_string_length = 0;
  (this->super_SceneEntity).name.field_2._M_local_buf[0] = '\0';
  pmVar1 = pstd::pmr::new_delete_resource();
  (this->super_SceneEntity).parameters.params.alloc.memoryResource = pmVar1;
  (this->super_SceneEntity).parameters.params.ptr = (ParsedParameter **)0x0;
  (this->super_SceneEntity).parameters.params.nAlloc = 0;
  (this->super_SceneEntity).parameters.params.nStored = 0;
  (this->super_SceneEntity).parameters.colorSpace = (RGBColorSpace *)0x0;
  (this->super_SceneEntity).loc.filename._M_len = 0;
  (this->super_SceneEntity).loc.filename._M_str = (char *)0x0;
  (this->super_SceneEntity).loc.line = 1;
  (this->super_SceneEntity).loc.column = 0;
  AnimatedTransform::AnimatedTransform(&this->renderFromObject);
  return;
}

Assistant:

TransformedSceneEntity() = default;